

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# u64.c
# Opt level: O2

size_t u64Weight(u64 w)

{
  long lVar1;
  ulong uVar2;
  
  uVar2 = w - (w >> 1 & 0x5555555555555555);
  uVar2 = (uVar2 >> 2 & 0x3333333333333333) + (uVar2 & 0x3333333333333333);
  uVar2 = (uVar2 >> 4) + uVar2 & 0xf0f0f0f0f0f0f0f;
  uVar2 = (uVar2 >> 8) + uVar2;
  lVar1 = (uVar2 >> 0x10) + uVar2;
  return (ulong)((int)((ulong)lVar1 >> 0x20) + (int)lVar1 & 0x7f);
}

Assistant:

size_t u64Weight(register u64 w)
{
	w -= ((w >> 1) & 0x5555555555555555);
	w = (w & 0x3333333333333333) + ((w >> 2) & 0x3333333333333333);
	w = (w + (w >> 4)) & 0x0F0F0F0F0F0F0F0F;
	w += w >> 8;
	w += w >> 16;
	w += w >> 32;
	return (size_t)(w & 0x000000000000007F);
}